

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanillaSynapseBuilder.cpp
# Opt level: O3

ISynapse * __thiscall
VanillaSynapseBuilder::Build
          (VanillaSynapseBuilder *this,size_t layerSize,size_t nextLayerSize,INeuron *prev,
          INeuron *next)

{
  BasicSynapse *this_00;
  float fVar1;
  
  this_00 = (BasicSynapse *)operator_new(0x40);
  fVar1 = std::
          generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                    ((this->super_ISynapseBuilder).generator);
  BasicSynapse::BasicSynapse
            (this_00,(bool)(undefined1)ISynapse::DEFAULT_SYNAPSE_UPDATABILITY,
             fVar1 * SQRT(3.0 / (float)nextLayerSize) + 0.0,(Time)ISynapse::DEFAULT_SYNAPSE_DELAY,
             prev,next);
  return &this_00->super_ISynapse;
}

Assistant:

ISynapse *VanillaSynapseBuilder::Build( size_t layerSize, size_t nextLayerSize, INeuron *prev, INeuron *next ) const
{
//    3 stands for some fixed constant from the article
    float limit = sqrt( 3.f / ( static_cast<float>( nextLayerSize )));
    std::uniform_real_distribution<float> distribution( 0, limit );
    return new BasicSynapse(
            ISynapse::DEFAULT_SYNAPSE_UPDATABILITY,
            distribution( generator ),
            ISynapse::DEFAULT_SYNAPSE_DELAY,
            prev, next );
}